

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
Game::getTeamMember(vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
                   Game *this,size_t playerID)

{
  value_type vVar1;
  size_type sVar2;
  reference rVar3;
  bool local_81;
  reference local_60 [2];
  reference local_40;
  value_type local_30;
  size_t i;
  size_t local_20;
  size_t playerID_local;
  Game *this_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *members;
  
  i._7_1_ = 0;
  local_20 = playerID;
  playerID_local = (size_t)this;
  this_local = (Game *)__return_storage_ptr__;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(__return_storage_ptr__);
  local_30 = 0;
  while( true ) {
    vVar1 = local_30;
    sVar2 = std::vector<bool,_std::allocator<bool>_>::size(&this->m_teams);
    if (sVar2 <= vVar1) break;
    local_81 = false;
    if (local_30 != local_20) {
      rVar3 = std::vector<bool,_std::allocator<bool>_>::at(&this->m_teams,local_20);
      local_40 = rVar3;
      rVar3 = std::vector<bool,_std::allocator<bool>_>::at(&this->m_teams,local_30);
      local_60[0] = rVar3;
      local_81 = std::_Bit_reference::operator==(&local_40,local_60);
    }
    if (local_81 != false) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (__return_storage_ptr__,&local_30);
    }
    local_30 = local_30 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<size_t> Game::getTeamMember(size_t playerID) {
    std::vector<size_t> members;
    for (size_t i = 0; i < m_teams.size(); i++) {
        if (i != playerID && m_teams.at(playerID) == m_teams.at(i))
            members.push_back(i);
    }
    return members;
}